

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O0

void brotli::EmitLiterals
               (uint8_t *input,size_t len,uint8_t *depth,uint16_t *bits,size_t *storage_ix,
               uint8_t *storage)

{
  ulong uStack_40;
  uint8_t lit;
  size_t j;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  uint16_t *bits_local;
  uint8_t *depth_local;
  size_t len_local;
  uint8_t *input_local;
  
  for (uStack_40 = 0; uStack_40 < len; uStack_40 = uStack_40 + 1) {
    WriteBits((ulong)depth[input[uStack_40]],(ulong)bits[input[uStack_40]],storage_ix,storage);
  }
  return;
}

Assistant:

inline void EmitLiterals(const uint8_t* input, const size_t len,
                         const uint8_t depth[256], const uint16_t bits[256],
                         size_t* storage_ix, uint8_t* storage) {
  for (size_t j = 0; j < len; j++) {
    const uint8_t lit = input[j];
    WriteBits(depth[lit], bits[lit], storage_ix, storage);
  }
}